

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O3

mmask_t __thiscall MouseButtonState::ToCursesState(MouseButtonState *this)

{
  uint uVar1;
  undefined *puVar2;
  
  if (this->doubleClicked == true) {
    uVar1 = this->button - 1;
    if (2 < uVar1) {
      return 0;
    }
    puVar2 = &DAT_001862d0;
  }
  else {
    if (this->clicked != true) {
      return 0;
    }
    uVar1 = this->button - 1;
    if (2 < uVar1) {
      return 0;
    }
    puVar2 = &DAT_001862dc;
  }
  return *(mmask_t *)(puVar2 + (ulong)uVar1 * 4);
}

Assistant:

mmask_t ToCursesState() noexcept {
        if (doubleClicked) {
            switch (button) {
            case 1: return BUTTON1_DOUBLE_CLICKED;
            case 2: return BUTTON2_DOUBLE_CLICKED;
            case 3: return BUTTON3_DOUBLE_CLICKED;
            default: break;
            }
        }
        else if (clicked) {
            switch (button) {
            case 1: return BUTTON1_CLICKED;
            case 2: return BUTTON2_CLICKED;
            case 3: return BUTTON3_CLICKED;
            default: break;
            }
        }
        return 0;
    }